

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::Update(BoardView *this)

{
  BackgroundImage *this_00;
  bool *v;
  float fVar1;
  float fVar2;
  uint uVar3;
  BRDFileBase *pBVar4;
  Component *this_01;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  ImVec2 IVar8;
  double dVar9;
  BoardView *pBVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  ImGuiIO *this_02;
  char *label;
  ImGuiIO *pIVar14;
  ImDrawList *draw;
  char **__source;
  KeyBindings *this_03;
  char (*s) [2048];
  int i;
  long lVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  allocator<char> local_d2;
  allocator<char> local_d1;
  path filepath;
  shared_ptr<Pin> pin;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  BoardView *local_80;
  string local_78;
  undefined1 local_58 [24];
  char *preset_filename;
  ImGuiIO *local_38;
  
  preset_filename = (char *)0x0;
  this_02 = ImGui::GetIO();
  if ((this_02->DisplaySize).x <= 0.0) {
    return;
  }
  if ((this_02->DisplaySize).y <= 0.0) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filepath,"Open",(allocator<char> *)&pin);
  this_03 = &this->keybindings;
  bVar11 = KeyBindings::isPressed(this_03,&filepath._M_pathname);
  std::__cxx11::string::~string((string *)&filepath);
  if (bVar11) {
    ImGuiIO::AddKeyEvent(this_02,ImGuiKey_RightCtrl,false);
    ImGuiIO::AddKeyEvent(this_02,ImGuiKey_LeftCtrl,false);
    ImGuiIO::AddKeyEvent(this_02,ImGuiKey_O,false);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filepath,"Quit",(allocator<char> *)&pin);
  bVar12 = KeyBindings::isPressed(this_03,&filepath._M_pathname);
  std::__cxx11::string::~string((string *)&filepath);
  if (bVar12) {
    this->m_wantsQuit = true;
  }
  bVar12 = ImGui::BeginMainMenuBar();
  local_80 = this;
  if (bVar12) {
    fVar16 = ImGui::GetWindowHeight();
    this->m_menu_height = fVar16;
    SearchComponent(this);
    ContextMenu(this);
    bVar12 = ImGui::BeginMenu("File",true);
    if (bVar12) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"Open",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,this_03,(string *)&pin);
      local_58._0_8_ = this_03;
      local_38 = this_02;
      bVar12 = ImGui::MenuItem("Open",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      bVar11 = bVar11 || bVar12;
      ImGui::Separator();
      s = (this->fhistory).history;
      for (lVar15 = 0; lVar15 < (this->fhistory).count; lVar15 = lVar15 + 1) {
        label = FHistory::Trim_filename(&this->fhistory,*s,2);
        bVar12 = ImGui::MenuItem(label,(char *)0x0,false,true);
        if (bVar12) {
          bVar11 = true;
          preset_filename = *s;
        }
        s = s + 1;
      }
      ImGui::Separator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"Search",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,(KeyBindings *)local_58._0_8_,(string *)&pin);
      this_02 = local_38;
      this = local_80;
      bVar12 = ImGui::MenuItem("Part/Net Search",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      this_03 = (KeyBindings *)local_58._0_8_;
      if ((bVar12) && (this->m_validBoard == true)) {
        this->m_showSearch = true;
      }
      ImGui::Separator();
      Preferences::Program::menuItem(&this->programPreferences);
      Preferences::Color::menuItem(&this->colorPreferences);
      Preferences::Keyboard::menuItem(&this->keyboardPreferences);
      Preferences::BoardSettings::menuItem(&this->boardSettings);
      ImGui::Separator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"Quit",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,this_03,(string *)&pin);
      bVar12 = ImGui::MenuItem("Quit",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      if (bVar12) {
        this->m_wantsQuit = true;
      }
      ImGui::EndMenu();
    }
    bVar12 = ImGui::BeginMenu("View",true);
    if (bVar12) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"Flip",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,this_03,(string *)&pin);
      bVar12 = ImGui::MenuItem("Flip board",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      if (bVar12) {
        FlipBoard(this,0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"RotateCW",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,this_03,(string *)&pin);
      bVar12 = ImGui::MenuItem("Rotate CW",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      if (bVar12) {
        Rotate(this,1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"RotateCCW",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,this_03,(string *)&pin);
      bVar12 = ImGui::MenuItem("Rotate CCW",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      if (bVar12) {
        Rotate(this,-1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"Center",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,this_03,(string *)&pin);
      bVar12 = ImGui::MenuItem("Reset View",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      if (bVar12) {
        CenterView(this);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pin,"Mirror",(allocator<char> *)&local_78);
      KeyBindings::getKeyNames(&filepath._M_pathname,this_03,(string *)&pin);
      bVar12 = ImGui::MenuItem("Mirror Board",filepath._M_pathname._M_dataplus._M_p,false,true);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::~string((string *)&pin);
      if (bVar12) {
        Mirror(this);
      }
      ImGui::Separator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Show FPS",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showFPS,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showFPS",(this->config).showFPS);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Show position",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showPosition,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPosition",(this->config).showPosition);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&filepath,"Show pins",&local_d1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"TogglePins",&local_d2)
      ;
      KeyBindings::getKeyNames((string *)&pin,this_03,&local_78);
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showPins,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPins",(this->config).showPins);
        this->m_needsRedraw = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Show net web",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showNetWeb,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showNetWeb",(this->config).showNetWeb);
        this->m_needsRedraw = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Show annotations",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showAnnotations,true)
      ;
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showAnnotations",(this->config).showAnnotations);
        this->m_needsRedraw = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Show parts name",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showPartName,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPartName",(this->config).showPartName);
        this->m_needsRedraw = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Show pins name",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showPinName,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showPinName",(this->config).showPinName);
        this->m_needsRedraw = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Show background image",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showBackgroundImage,
                          true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool
                  (&this->obvconfig,"showBackgroundImage",(this->config).showBackgroundImage);
        (this->backgroundImage).enabled = (this->config).showBackgroundImage;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Fill board",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).boardFill,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"boardFill",(this->config).boardFill);
        this->m_needsRedraw = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filepath,"Fill parts",(allocator<char> *)&local_78);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._M_local_buf[0] = '\0';
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&local_98;
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).fillParts,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"fillParts",(this->config).fillParts);
        this->m_needsRedraw = true;
      }
      ImGui::Separator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&filepath,"Info Panel",&local_d1)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"InfoPanel",&local_d2);
      KeyBindings::getKeyNames((string *)&pin,this_03,&local_78);
      bVar12 = MenuItemWithCheckbox
                         (&filepath._M_pathname,(string *)&pin,&(this->config).showInfoPanel,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&filepath);
      if (bVar12) {
        Confparse::WriteBool(&this->obvconfig,"showInfoPanel",(this->config).showInfoPanel);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&filepath,"Net List",&local_d1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"NetList",&local_d2);
      KeyBindings::getKeyNames((string *)&pin,this_03,&local_78);
      MenuItemWithCheckbox(&filepath._M_pathname,(string *)&pin,&this->m_showNetList,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&filepath);
      std::__cxx11::string::string<std::allocator<char>>((string *)&filepath,"Part List",&local_d1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"PartList",&local_d2);
      KeyBindings::getKeyNames((string *)&pin,this_03,&local_78);
      MenuItemWithCheckbox(&filepath._M_pathname,(string *)&pin,&this->m_showPartList,true);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&filepath);
      ImGui::EndMenu();
    }
    bVar12 = ImGui::BeginMenu("Help##1",true);
    if (bVar12) {
      Help::Controls::menuItem(&this->helpControls);
      Help::About::menuItem(&this->helpAbout);
      ImGui::EndMenu();
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(10);
    filepath._M_pathname._M_dataplus._M_p._4_4_ = 1.0;
    filepath._M_pathname._M_dataplus._M_p._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)&filepath);
    ImGui::SameLine(0.0,-1.0);
    v = &(this->config).showAnnotations;
    bVar12 = ImGui::Checkbox("Annotations",v);
    if (bVar12) {
      Confparse::WriteBool(&this->obvconfig,"showAnnotations",(this->config).showAnnotations);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar12 = ImGui::Checkbox("Netweb",&(this->config).showNetWeb);
    if (bVar12) {
      Confparse::WriteBool(&this->obvconfig,"showNetWeb",(this->config).showNetWeb);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar12 = ImGui::Checkbox("Pins",&(this->config).showPins);
    if (bVar12) {
      Confparse::WriteBool(&this->obvconfig,"showPins",(this->config).showPins);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar12 = ImGui::Checkbox("Image",&(this->config).showBackgroundImage);
    if (bVar12) {
      Confparse::WriteBool
                (&this->obvconfig,"showBackgroundImage",(this->config).showBackgroundImage);
      (this->backgroundImage).enabled = (this->config).showBackgroundImage;
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(0x28);
    filepath._M_pathname._M_dataplus._M_p._4_4_ = 1.0;
    filepath._M_pathname._M_dataplus._M_p._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)&filepath);
    ImGui::SameLine(0.0,-1.0);
    pBVar10 = local_80;
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button(" - ",(ImVec2 *)&filepath);
    if (bVar12) {
      Zoom(pBVar10,(pBVar10->m_board_surface).x * 0.5,(pBVar10->m_board_surface).y * 0.5,
           -(pBVar10->config).zoomFactor);
    }
    ImGui::SameLine(0.0,-1.0);
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button(" + ",(ImVec2 *)&filepath);
    if (bVar12) {
      Zoom(pBVar10,(pBVar10->m_board_surface).x * 0.5,(pBVar10->m_board_surface).y * 0.5,
           (pBVar10->config).zoomFactor);
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(0x14);
    filepath._M_pathname._M_dataplus._M_p._4_4_ = 1.0;
    filepath._M_pathname._M_dataplus._M_p._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)&filepath);
    ImGui::SameLine(0.0,-1.0);
    pBVar10 = local_80;
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button("-",(ImVec2 *)&filepath);
    if (bVar12) {
      Zoom(pBVar10,(pBVar10->m_board_surface).x * 0.5,(pBVar10->m_board_surface).y * 0.5,
           -(pBVar10->config).zoomFactor / (float)(pBVar10->config).zoomModifier);
    }
    ImGui::SameLine(0.0,-1.0);
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button("+",(ImVec2 *)&filepath);
    if (bVar12) {
      Zoom(pBVar10,(pBVar10->m_board_surface).x * 0.5,(pBVar10->m_board_surface).y * 0.5,
           (pBVar10->config).zoomFactor / (float)(pBVar10->config).zoomModifier);
    }
    ImGui::SameLine(0.0,-1.0);
    iVar13 = DPI(0x14);
    filepath._M_pathname._M_dataplus._M_p._4_4_ = 1.0;
    filepath._M_pathname._M_dataplus._M_p._0_4_ = (float)iVar13;
    ImGui::Dummy((ImVec2 *)&filepath);
    ImGui::SameLine(0.0,-1.0);
    this = local_80;
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button(" < ",(ImVec2 *)&filepath);
    if (bVar12) {
      Rotate(this,-1);
    }
    ImGui::SameLine(0.0,-1.0);
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button(" ^ ",(ImVec2 *)&filepath);
    if (bVar12) {
      FlipBoard(this,0);
    }
    ImGui::SameLine(0.0,-1.0);
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button(" > ",(ImVec2 *)&filepath);
    if (bVar12) {
      Rotate(this,1);
    }
    ImGui::SameLine(0.0,-1.0);
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button("X",(ImVec2 *)&filepath);
    if (bVar12) {
      CenterView(this);
    }
    ImGui::SameLine(0.0,-1.0);
    filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar12 = ImGui::Button("CLEAR",(ImVec2 *)&filepath);
    if (bVar12) {
      ClearAllHighlights(this);
    }
    if (((this->m_showContextMenu == true) && (this->m_file != (BRDFileBase *)0x0)) && (*v == true))
    {
      ImGui::OpenPopup("Annotations",0);
    }
    Help::About::render(&this->helpAbout);
    Help::Controls::render(&this->helpControls);
    Preferences::Program::render(&this->programPreferences);
    bVar12 = Preferences::Color::render(&this->colorPreferences);
    if (bVar12) {
      this->m_needsRedraw = true;
    }
    Preferences::Keyboard::render(&this->keyboardPreferences);
    Preferences::BoardSettings::render(&this->boardSettings);
    if ((this->m_showSearch == true) && (this->m_file != (BRDFileBase *)0x0)) {
      ImGui::OpenPopup("Search for Component / Network",0);
    }
    bVar12 = ImGui::BeginPopupModal("Error opening file",(bool *)0x0,0);
    if (bVar12) {
      ImGui::Text("There was an error opening the file: %s",
                  (this->m_lastFileOpenName)._M_dataplus._M_p);
      if ((this->m_error_msg)._M_string_length != 0) {
        ImGui::Text("%s",(this->m_error_msg)._M_dataplus._M_p);
      }
      pBVar4 = this->m_file;
      if ((pBVar4 != (BRDFileBase *)0x0) && ((pBVar4->error_msg)._M_string_length != 0)) {
        ImGui::Text("%s",(pBVar4->error_msg)._M_dataplus._M_p);
      }
      filepath._M_pathname._M_dataplus._M_p = (pointer)0x0;
      bVar12 = ImGui::Button("OK",(ImVec2 *)&filepath);
      if (bVar12) {
        ImGui::CloseCurrentPopup();
      }
      ImGui::EndPopup();
    }
    if (this->m_lastFileOpenWasInvalid == true) {
      ImGui::OpenPopup("Error opening file",0);
      this->m_lastFileOpenWasInvalid = false;
    }
    ImGui::EndMainMenuBar();
    if (bVar11 != false) {
LAB_00114277:
      std::filesystem::__cxx11::path::path(&filepath);
      if (preset_filename == (char *)0x0) {
        show_file_picker_abi_cxx11_((path *)&pin,true);
        std::filesystem::__cxx11::path::operator=(&filepath,(path *)&pin);
        std::filesystem::__cxx11::path::~path((path *)&pin);
        pIVar14 = ImGui::GetIO();
        pIVar14->MouseDown[0] = false;
        pIVar14->MouseClicked[0] = false;
        pIVar14->MouseClickedPos[0].x = 0.0;
        pIVar14->MouseClickedPos[0].y = 0.0;
      }
      else {
        std::filesystem::__cxx11::u8path<char*,std::filesystem::__cxx11::path,char>
                  ((path *)&pin,(__cxx11 *)&preset_filename,__source);
        std::filesystem::__cxx11::path::operator=(&filepath,(path *)&pin);
        std::filesystem::__cxx11::path::~path((path *)&pin);
        preset_filename = (char *)0x0;
      }
      if (filepath._M_pathname._M_string_length != 0) {
        LoadFile(this,&filepath);
      }
      std::filesystem::__cxx11::path::~path(&filepath);
    }
  }
  else if (bVar11) goto LAB_00114277;
  fVar16 = DPIF(10.0);
  local_58._0_4_ = fVar16;
  fVar16 = ImGui::GetFontSize();
  this->m_status_height = fVar16 + (float)local_58._0_4_;
  local_58._0_4_ = DPIF(4.0);
  filepath._M_pathname._M_dataplus._M_p._4_4_ = DPIF(3.0);
  filepath._M_pathname._M_dataplus._M_p._0_4_ = (float)local_58._0_4_;
  ImGui::PushStyleVar(2,(ImVec2 *)&filepath);
  ImGui::PushStyleVar(3,0.0);
  ImGui::PushStyleVar(4,1.0);
  filepath._M_pathname._M_dataplus._M_p =
       (pointer)((ulong)(uint)((this_02->DisplaySize).y - this->m_status_height) << 0x20);
  pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ImGui::SetNextWindowPos((ImVec2 *)&filepath,0,(ImVec2 *)&pin);
  filepath._M_pathname._M_dataplus._M_p._4_4_ = this->m_status_height;
  filepath._M_pathname._M_dataplus._M_p._0_4_ = (this_02->DisplaySize).x;
  ImGui::SetNextWindowSize((ImVec2 *)&filepath,0);
  ImGui::Begin("status",(bool *)0x0,0x112f);
  if (((this->m_file == (BRDFileBase *)0x0) || (this->m_board == (Board *)0x0)) ||
     ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0)) {
    IVar8 = ImGui::GetMousePos();
    IVar8 = ScreenToCoord(this,IVar8.x,IVar8.y,1.0);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_4_ = IVar8.x;
    local_58._4_4_ = IVar8.y;
    local_58._12_4_ = extraout_XMM0_Dd;
    if ((this->config).showFPS == true) {
      pIVar14 = ImGui::GetIO();
      ImGui::Text("FPS: %0.0f ",SUB84((double)pIVar14->Framerate,0));
      ImGui::SameLine(0.0,-1.0);
    }
    if (this->debug == true) {
      ImGui::Text("AnnID:%d ");
      ImGui::SameLine(0.0,-1.0);
    }
    if ((this->config).showPosition == true) {
      ImGui::Text("Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)",
                  SUB84((double)((float)local_58._0_4_ / 1000.0),0),
                  (double)((float)local_58._4_4_ / 1000.0),(double)(float)local_58._0_4_ * 0.0254,
                  (double)(float)local_58._4_4_ * 0.0254);
      ImGui::SameLine(0.0,-1.0);
    }
    if (this->m_validBoard == true) {
      IVar8 = ImGui::CalcTextSize((this->fhistory).history[0],(char *)0x0,false,-1.0);
      local_58._8_4_ = extraout_XMM0_Dc_00;
      local_58._0_4_ = IVar8.x;
      local_58._4_4_ = IVar8.y;
      local_58._12_4_ = extraout_XMM0_Dd_00;
      fVar16 = ImGui::GetWindowWidth();
      ImGui::SameLine((fVar16 - (float)local_58._0_4_) + -20.0,-1.0);
      ImGui::Text("%s");
      ImGui::SameLine(0.0,-1.0);
    }
    ImGui::Text(" ");
  }
  else {
    std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>,
               &(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>);
    this_01 = ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->component).
              super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar5 = (this_01->name)._M_dataplus._M_p;
    pcVar6 = ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name)._M_dataplus.
             _M_p;
    pcVar7 = ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net->name).
             _M_dataplus._M_p;
    uVar3 = *(uint *)&((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net->
                      super_BoardElement).field_0xc;
    Component::mount_type_str_abi_cxx11_(&filepath._M_pathname,this_01);
    ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",pcVar5,pcVar6,pcVar7,(ulong)uVar3
                ,filepath._M_pathname._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&filepath);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this = local_80;
  }
  ImGui::End();
  ImGui::PopStyleVar(1);
  ImGui::PopStyleVar(1);
  ImGui::PopStyleVar(1);
  if ((this->config).showInfoPanel == false) {
    fVar17 = (this_02->DisplaySize).x;
    fVar16 = (this_02->DisplaySize).y;
  }
  else {
    fVar16 = (this_02->DisplaySize).y;
    fVar17 = (this_02->DisplaySize).x - (this->m_info_surface).x;
  }
  fVar1 = this->m_menu_height;
  fVar2 = this->m_status_height;
  (this->m_board_surface).x = fVar17;
  (this->m_board_surface).y = fVar16 - (fVar2 + fVar1);
  filepath._M_pathname._M_dataplus._M_p = (pointer)((ulong)(uint)fVar1 << 0x20);
  pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ImGui::SetNextWindowPos((ImVec2 *)&filepath,0,(ImVec2 *)&pin);
  fVar16 = (this_02->DisplaySize).x;
  if ((fVar16 == this->m_lastWidth) && (!NAN(fVar16) && !NAN(this->m_lastWidth))) {
    fVar16 = (this_02->DisplaySize).y;
    if ((fVar16 == this->m_lastHeight) && (!NAN(fVar16) && !NAN(this->m_lastHeight)))
    goto LAB_0011470f;
  }
  fVar16 = (this->m_board_surface).y;
  this->m_lastWidth = (this->m_board_surface).x;
  this->m_lastHeight = fVar16;
  this->m_needsRedraw = true;
LAB_0011470f:
  ImGui::SetNextWindowSize(&this->m_board_surface,0);
  ImGui::PushStyleVar(3,0.0);
  ImGui::PushStyleVar(4,1.0);
  ImGui::PushStyleColor(2,(this->m_colors).backgroundColor);
  ImGui::Begin("surface",(bool *)0x0,0x1313f);
  if (this->m_validBoard == true) {
    HandleInput(this);
    this_00 = &this->backgroundImage;
    draw = ImGui::GetWindowDrawList();
    fVar16 = BackgroundImage::x0(this_00);
    local_58._0_4_ = fVar16;
    dVar9 = BackgroundImage::y0(this_00,(double)CONCAT44(extraout_XMM0_Db,fVar16));
    filepath._M_pathname._M_dataplus._M_p =
         (pointer)CoordToScreen(this,(float)local_58._0_4_,SUB84(dVar9,0),1.0);
    local_58._0_4_ = BackgroundImage::x1(this_00);
    dVar9 = BackgroundImage::y1(this_00,(double)CONCAT44(extraout_XMM0_Db_00,local_58._0_4_));
    pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CoordToScreen(local_80,(float)local_58._0_4_,SUB84(dVar9,0),1.0);
    this = local_80;
    BackgroundImage::render(this_00,draw,(ImVec2 *)&filepath,(ImVec2 *)&pin,local_80->m_rotation);
    DrawBoard(this);
  }
  ImGui::End();
  ImGui::PopStyleColor(1);
  ImGui::PopStyleVar(1);
  RenderOverlay(this);
  ImGui::PopStyleVar(1);
  HandlePDFBridgeSelection(this);
  return;
}

Assistant:

void BoardView::Update() {
	bool open_file = false;
	// ImGuiIO &io = ImGui::GetIO();
	char *preset_filename = NULL;
	ImGuiIO &io           = ImGui::GetIO();

	// Window is probably minimized, do not attempt to draw anything as our code will not handle screen size of 0 properly and crash (ocornut/imgui@bb2529d)
	if (io.DisplaySize.x <= 0.0f || io.DisplaySize.y <= 0.0f) {
		return;
	}

	/**
	 * ** FIXME
	 * This should be handled in the keyboard section, not here
	 */
	if (keybindings.isPressed("Open")) {
		open_file = true;
		// the dialog will likely eat our WM_KEYUP message for CTRL and O:
		io.AddKeyEvent(ImGuiKey_RightCtrl, false);
		io.AddKeyEvent(ImGuiKey_LeftCtrl, false);
		io.AddKeyEvent(ImGuiKey_O, false);

	}

	if (keybindings.isPressed("Quit")) {
		m_wantsQuit = true;
	}

	if (ImGui::BeginMainMenuBar()) {
		m_menu_height = ImGui::GetWindowHeight();

		/*
		 * Create these dialogs, but they're not actually
		 * visible until they're called up by the respective
		 * flags.
		 */
		SearchComponent();
		ContextMenu();

		if (ImGui::BeginMenu("File")) {
			if (ImGui::MenuItem("Open", keybindings.getKeyNames("Open").c_str())) {
				open_file = true;
			}

			/// Generate file history - PLD20160618-2028
			ImGui::Separator();
			{
				int i;
				for (i = 0; i < fhistory.count; i++) {
					if (ImGui::MenuItem(fhistory.Trim_filename(fhistory.history[i], 2))) {
						open_file       = true;
						preset_filename = fhistory.history[i];
					}
				}
			}
			ImGui::Separator();

			if (ImGui::MenuItem("Part/Net Search", keybindings.getKeyNames("Search").c_str())) {
				if (m_validBoard) m_showSearch = true;
			}

			ImGui::Separator();

			programPreferences.menuItem();
			colorPreferences.menuItem();
			keyboardPreferences.menuItem();
			boardSettings.menuItem();

			ImGui::Separator();

			if (ImGui::MenuItem("Quit", keybindings.getKeyNames("Quit").c_str())) {
				m_wantsQuit = true;
			}
			ImGui::EndMenu();
		}
		if (ImGui::BeginMenu("View")) {
			if (ImGui::MenuItem("Flip board", keybindings.getKeyNames("Flip").c_str())) {
				FlipBoard();
			}
			if (ImGui::MenuItem("Rotate CW", keybindings.getKeyNames("RotateCW").c_str())) {
				Rotate(1);
			}
			if (ImGui::MenuItem("Rotate CCW", keybindings.getKeyNames("RotateCCW").c_str())) {
				Rotate(-1);
			}
			if (ImGui::MenuItem("Reset View", keybindings.getKeyNames("Center").c_str())) {
				CenterView();
			}
			if (ImGui::MenuItem("Mirror Board", keybindings.getKeyNames("Mirror").c_str())) {
				Mirror();
			}

			ImGui::Separator();
			if (MenuItemWithCheckbox("Show FPS", {}, config.showFPS)) {
				obvconfig.WriteBool("showFPS", config.showFPS);
			}

			if (MenuItemWithCheckbox("Show position", {}, config.showPosition)) {
				obvconfig.WriteBool("showPosition", config.showPosition);
			}

			if (MenuItemWithCheckbox("Show pins", keybindings.getKeyNames("TogglePins"), config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show net web", {}, config.showNetWeb)) {
				obvconfig.WriteBool("showNetWeb", config.showNetWeb);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show annotations", {}, config.showAnnotations)) {
				obvconfig.WriteBool("showAnnotations", config.showAnnotations);
				m_needsRedraw = true;
			}


			if (MenuItemWithCheckbox("Show parts name", {}, config.showPartName)) {
				obvconfig.WriteBool("showPartName", config.showPartName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show pins name", {}, config.showPinName)) {
				obvconfig.WriteBool("showPinName", config.showPinName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show background image", {}, config.showBackgroundImage)) {
				obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
				backgroundImage.enabled = config.showBackgroundImage;
			}

			if (MenuItemWithCheckbox("Fill board", {}, config.boardFill)) {
				obvconfig.WriteBool("boardFill", config.boardFill);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Fill parts", {}, config.fillParts)) {
				obvconfig.WriteBool("fillParts", config.fillParts);
				m_needsRedraw = true;
			}

			ImGui::Separator();

			if (MenuItemWithCheckbox("Info Panel", keybindings.getKeyNames("InfoPanel"), config.showInfoPanel)) {
				obvconfig.WriteBool("showInfoPanel", config.showInfoPanel);
			}
			MenuItemWithCheckbox("Net List", keybindings.getKeyNames("NetList"), m_showNetList);
			MenuItemWithCheckbox("Part List", keybindings.getKeyNames("PartList"), m_showPartList);

			ImGui::EndMenu();
		}

		if (ImGui::BeginMenu("Help##1")) {
			helpControls.menuItem();
			helpAbout.menuItem();

			ImGui::EndMenu();
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(10), 1));
		ImGui::SameLine();
		if (ImGui::Checkbox("Annotations", &config.showAnnotations)) {
			obvconfig.WriteBool("showAnnotations", config.showAnnotations);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Netweb", &config.showNetWeb)) {
			obvconfig.WriteBool("showNetWeb", config.showNetWeb);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		{
			if (ImGui::Checkbox("Pins", &config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Image", &config.showBackgroundImage)) {
			obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
			backgroundImage.enabled = config.showBackgroundImage;
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(40), 1));

		ImGui::SameLine();
		if (ImGui::Button(" - ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);
		}
		ImGui::SameLine();
		if (ImGui::Button(" + ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);
		}
		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button("-")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor / config.zoomModifier);
		}
		ImGui::SameLine();
		if (ImGui::Button("+")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor / config.zoomModifier);
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button(" < ")) {
			Rotate(-1);
		}

		ImGui::SameLine();
		if (ImGui::Button(" ^ ")) {
			FlipBoard();
		}

		ImGui::SameLine();
		if (ImGui::Button(" > ")) {
			Rotate(1);
		}

		ImGui::SameLine();
		if (ImGui::Button("X")) {
			CenterView();
		}

		ImGui::SameLine();
		if (ImGui::Button("CLEAR")) {
			ClearAllHighlights();
		}

		/*
		ImGui::SameLine();
		ImVec2 tz = ImGui::CalcTextSize("Search             ");
		ImGui::PushItemWidth(-tz.x);
		ImGui::Text("Search");
		ImGui::SameLine();
		ImGui::PushItemWidth(-DPI(1));
		if (ImGui::InputText("##ansearch", m_search, 128, 0)) {
		}
		ImGui::PopItemWidth();
		*/

		if (m_showContextMenu && m_file && config.showAnnotations) {
			ImGui::OpenPopup("Annotations");
		}

		helpAbout.render();
		helpControls.render();

		programPreferences.render();

		if (colorPreferences.render()) {
			m_needsRedraw = true;
		};

		keyboardPreferences.render();
		boardSettings.render();

		if (m_showSearch && m_file) {
			ImGui::OpenPopup("Search for Component / Network");
		}

		if (ImGui::BeginPopupModal("Error opening file")) {
			ImGui::Text("There was an error opening the file: %s", m_lastFileOpenName.c_str());
			if (!m_error_msg.empty()) {
				ImGui::Text("%s", m_error_msg.c_str());
			}
			if (m_file && !m_file->error_msg.empty()) {
				ImGui::Text("%s", m_file->error_msg.c_str());
			}
			if (ImGui::Button("OK")) {
				ImGui::CloseCurrentPopup();
			}
			ImGui::EndPopup();
		}
		if (m_lastFileOpenWasInvalid) {
			ImGui::OpenPopup("Error opening file");
			m_lastFileOpenWasInvalid = false;
		}
		ImGui::EndMainMenuBar();
	}

	if (open_file) {
		filesystem::path filepath;

		if (preset_filename) {
			filepath        = filesystem::u8path(preset_filename);
			preset_filename = NULL;
		} else {
			filepath = show_file_picker(true);

			ImGuiIO &io           = ImGui::GetIO();
			io.MouseDown[0]       = false;
			io.MouseClicked[0]    = false;
			io.MouseClickedPos[0] = ImVec2(0, 0);
		}

		if (!filepath.empty()) {
			LoadFile(filepath);
		}
	}

	ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove |
	                         ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;

	// ImGui's keyboard navigation is disabled for the boardview area as we use our own key bindings
	ImGuiWindowFlags draw_surface_flags = flags | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoBringToFrontOnFocus |
		ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_NoNavInputs;

	/*
	 * Status footer
	 */
	m_status_height = (DPIF(10.0f) + ImGui::GetFontSize());
	ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(DPIF(4.0f), DPIF(3.0f)));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::SetNextWindowPos(ImVec2(0, io.DisplaySize.y - m_status_height));
	ImGui::SetNextWindowSize(ImVec2(io.DisplaySize.x, m_status_height));
	ImGui::Begin("status", nullptr, flags | ImGuiWindowFlags_NoFocusOnAppearing);
	if (m_file && m_board && m_pinSelected) {
		auto pin = m_pinSelected;
		ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",
		            pin->component->name.c_str(),
		            pin->name.c_str(),
		            pin->net->name.c_str(),
		            pin->net->number,
		            pin->component->mount_type_str().c_str());
	} else {
		ImVec2 spos = ImGui::GetMousePos();
		ImVec2 pos  = ScreenToCoord(spos.x, spos.y);
		if (config.showFPS == true) {
			ImGui::Text("FPS: %0.0f ", ImGui::GetIO().Framerate);
			ImGui::SameLine();
		}

		if (debug) {
			ImGui::Text("AnnID:%d ", m_annotation_clicked_id);
			ImGui::SameLine();
		}

		if (config.showPosition == true) {
			ImGui::Text("Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)", pos.x / 1000, pos.y / 1000, pos.x * 0.0254, pos.y * 0.0254);
			ImGui::SameLine();
		}

		{
			if (m_validBoard) {
				ImVec2 s = ImGui::CalcTextSize(fhistory.history[0]);
				ImGui::SameLine(ImGui::GetWindowWidth() - s.x - 20);
				ImGui::Text("%s", fhistory.history[0]);
				ImGui::SameLine();
			}
		}
		ImGui::Text(" ");
	}
	ImGui::End();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();

	if (!config.showInfoPanel) {
		m_board_surface = ImVec2(io.DisplaySize.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	} else {
		m_board_surface = ImVec2(io.DisplaySize.x - m_info_surface.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	}
	/*
	 * Drawing surface, where the actual PCB/board is plotted out
	 */
	ImGui::SetNextWindowPos(ImVec2(0, m_menu_height));
	if (io.DisplaySize.x != m_lastWidth || io.DisplaySize.y != m_lastHeight) {
		//		m_lastWidth   = io.DisplaySize.x;
		//		m_lastHeight  = io.DisplaySize.y;
		m_lastWidth   = m_board_surface.x;
		m_lastHeight  = m_board_surface.y;
		m_needsRedraw = true;
	}

	ImGui::SetNextWindowSize(m_board_surface);

	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::PushStyleColor(ImGuiCol_WindowBg, m_colors.backgroundColor);

	ImGui::Begin("surface", nullptr, draw_surface_flags);
	if (m_validBoard) {
		HandleInput();
		backgroundImage.render(*ImGui::GetWindowDrawList(),
			CoordToScreen(backgroundImage.x0(), backgroundImage.y0()),
			CoordToScreen(backgroundImage.x1(), backgroundImage.y1()),
			m_rotation);
		DrawBoard();
	}
	ImGui::End();
	ImGui::PopStyleColor();
	ImGui::PopStyleVar();

	// Overlay
	RenderOverlay();

	ImGui::PopStyleVar();

	HandlePDFBridgeSelection();

}